

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::BeginAssertionInst::Exec
          (BeginAssertionInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  CharCount startInputOffset;
  code *pcVar1;
  bool bVar2;
  Label beginLabel;
  undefined4 *puVar3;
  AssertionInfo *this_00;
  size_t contStackPosition;
  PopAssertionCont *this_01;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  BeginAssertionInst *this_local;
  
  if ((BeginAssertionInst *)*instPointer != this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x1123,"(instPointer == (uint8*)this)","instPointer == (uint8*)this");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (((this->super_NegationMixin).isNegation & 1U) == 0) {
    Matcher::SaveInnerGroups
              (matcher,(this->super_BodyGroupsMixin).minBodyGroupId,
               (this->super_BodyGroupsMixin).maxBodyGroupId,false,input,contStack);
  }
  this_00 = (AssertionInfo *)
            ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>::Push
                      (&assertionStack->
                        super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>);
  beginLabel = Matcher::InstPointerToLabel(matcher,*instPointer);
  startInputOffset = *inputOffset;
  contStackPosition = ContinuousPageStack<1UL>::Position((ContinuousPageStack<1UL> *)contStack);
  AssertionInfo::AssertionInfo(this_00,beginLabel,startInputOffset,contStackPosition);
  this_01 = (PopAssertionCont *)
            ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
            Push<UnifiedRegex::PopAssertionCont>
                      (&contStack->
                        super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
  PopAssertionCont::PopAssertionCont(this_01);
  Matcher::PushStats(matcher,contStack,input);
  *instPointer = *instPointer + 0xe;
  return false;
}

Assistant:

inline bool BeginAssertionInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        Assert(instPointer == (uint8*)this);

        if (!isNegation)
        {
            // If the positive assertion binds some groups then on success any RestoreGroup continuations pushed
            // in the assertion body will be cut. Hence if the entire assertion is backtracked over we must restore
            // the current inner group bindings.
            matcher.SaveInnerGroups(minBodyGroupId, maxBodyGroupId, false, input, contStack);
        }

        PUSHA(assertionStack, AssertionInfo, matcher.InstPointerToLabel(instPointer), inputOffset, contStack.Position());
        PUSH(contStack, PopAssertionCont);
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.PushStats(contStack, input);
#endif

        instPointer += sizeof(*this);
        return false;
    }